

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O3

void Abc_FrameCopyLTLDataBase(Abc_Frame_t *pAbc,Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  char *__s;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  size_t sVar5;
  char *__dest;
  int iVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  
  pVVar7 = pAbc->vLTLProperties_global;
  if (pVVar7 != (Vec_Ptr_t *)0x0) {
    if (pVVar7->pArray != (void **)0x0) {
      free(pVVar7->pArray);
    }
    free(pVVar7);
  }
  pVVar7 = pNtk->vLtlProperties;
  iVar1 = pVVar7->nSize;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  iVar6 = 8;
  if (6 < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar3->nSize = 0;
  pVVar3->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar6 << 3);
  }
  pVVar3->pArray = ppvVar4;
  pAbc->vLTLProperties_global = pVVar3;
  if (0 < iVar1) {
    lVar8 = 0;
    do {
      __s = (char *)pVVar7->pArray[lVar8];
      sVar5 = strlen(__s);
      __dest = (char *)malloc(sVar5 + 1);
      strcpy(__dest,__s);
      pVVar7 = pAbc->vLTLProperties_global;
      uVar2 = pVVar7->nSize;
      if (uVar2 == pVVar7->nCap) {
        if ((int)uVar2 < 0x10) {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar7->pArray,0x80);
          }
          pVVar7->pArray = ppvVar4;
          pVVar7->nCap = 0x10;
        }
        else {
          if (pVVar7->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(pVVar7->pArray,(ulong)uVar2 << 4);
          }
          pVVar7->pArray = ppvVar4;
          pVVar7->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar4 = pVVar7->pArray;
      }
      iVar1 = pVVar7->nSize;
      pVVar7->nSize = iVar1 + 1;
      ppvVar4[iVar1] = __dest;
      lVar8 = lVar8 + 1;
      pVVar7 = pNtk->vLtlProperties;
    } while (lVar8 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Abc_FrameCopyLTLDataBase( Abc_Frame_t *pAbc, Abc_Ntk_t * pNtk )
{
    char *pLtlFormula, *tempFormula;
    int i;

    if( pAbc->vLTLProperties_global != NULL )
    {
//        printf("Deleting exisitng LTL database from the frame\n");
        Vec_PtrFree( pAbc->vLTLProperties_global );
        pAbc->vLTLProperties_global = NULL;
    }
    pAbc->vLTLProperties_global = Vec_PtrAlloc(Vec_PtrSize(pNtk->vLtlProperties));
    Vec_PtrForEachEntry( char *, pNtk->vLtlProperties, pLtlFormula, i )
    {
        tempFormula = (char *)malloc( sizeof(char)*(strlen(pLtlFormula)+1) );
        sprintf( tempFormula, "%s", pLtlFormula );
        Vec_PtrPush( pAbc->vLTLProperties_global, tempFormula );
    }
}